

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::checkAtoms(FragmentStamp *this)

{
  __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
  _Var1;
  ostream *poVar2;
  OpenMDException *this_00;
  string sStack_1b8;
  ostringstream oss;
  
  _oss = 0;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomStamp**,std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomStamp*const>>
                    ((this->atomStamps_).
                     super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->atomStamps_).
                     super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->atomStamps_).
      super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error in Fragment ");
  std::__cxx11::string::string((string *)&sStack_1b8,(string *)&(this->Name).data_);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_1b8);
  poVar2 = std::operator<<(poVar2,": atom[");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2,"] is missing\n");
  std::__cxx11::string::~string((string *)&sStack_1b8);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&sStack_1b8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void FragmentStamp::checkAtoms() {
    std::vector<AtomStamp*>::iterator ai = std::find(
        atomStamps_.begin(), atomStamps_.end(), static_cast<AtomStamp*>(NULL));
    if (ai != atomStamps_.end()) {
      std::ostringstream oss;
      oss << "Error in Fragment " << getName() << ": atom["
          << ai - atomStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }
  }